

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O3

void __thiscall HDualRow::update_flip(HDualRow *this,HVector *bfrtColumn)

{
  double multi;
  int iCol;
  pointer ppVar1;
  long lVar2;
  long lVar3;
  
  HVector::clear(bfrtColumn);
  if (0 < this->workCount) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      ppVar1 = (this->workData).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iCol = *(int *)((long)ppVar1 + lVar3 + -8);
      multi = *(double *)((long)&ppVar1->first + lVar3);
      HModel::flipBound(this->workModel,iCol);
      HMatrix::collect_aj(&this->workModel->matrix,bfrtColumn,iCol,multi);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < this->workCount);
  }
  return;
}

Assistant:

void HDualRow::update_flip(HVector *bfrtColumn) {
    bfrtColumn->clear();
    for (int i = 0; i < workCount; i++) {
        const int iCol = workData[i].first;
        const double change = workData[i].second;
        workModel->flipBound(iCol);
        workModel->getMatrix()->collect_aj(*bfrtColumn, iCol, change);
    }
}